

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

Node verona::append_fq(Node *fq,Node *node)

{
  TokenDef *pTVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *in_R8;
  Node NVar5;
  WFLookup local_280;
  undefined1 *local_260;
  undefined1 local_258 [8];
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_250;
  Node local_238;
  Node local_228;
  Node local_218;
  Node local_208;
  Node local_1f8;
  Node local_1e8;
  Node local_1d8;
  Node local_1c8;
  Node local_1b8;
  Node local_1a8;
  Node local_198;
  Node local_188;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_158;
  undefined1 local_148 [16];
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_128;
  undefined1 local_118 [16];
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_c8 [16];
  WFLookup local_b8;
  WFLookup local_98;
  Token local_78;
  WFLookup local_70;
  Token local_50;
  Token local_48;
  Token local_40;
  Token local_38;
  
  local_280.wf = (Wellformed *)local_258;
  local_258 = (undefined1  [8])FQType;
  local_250._M_ptr = (element_type *)FQFunction;
  local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x2;
  bVar2 = trieste::Token::in(&((node->
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->type_,(initializer_list<trieste::Token> *)&local_280);
  if (!bVar2) {
    __assert_fail("fq->type().in({FQType, FQFunction})",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a0,"Node verona::append_fq(Node, Node)");
  }
  local_280.wf = (Wellformed *)TypeClassName;
  local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&TypeAliasName;
  local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TypeParamName;
  local_280.index = (size_t)TypeTraitName;
  local_260 = Selector;
  local_250._M_ptr = (element_type *)0x5;
  local_258 = (undefined1  [8])&local_280;
  bVar2 = trieste::Token::in(&in_RDX->_M_ptr->type_,(initializer_list<trieste::Token> *)local_258);
  if (bVar2) {
    peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pTVar1 = (in_RDX->_M_ptr->type_).def;
    if ((peVar4->type_).def == (TokenDef *)FQFunction) {
      if (pTVar1 == (TokenDef *)Selector) {
        __assert_fail("node != Selector",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                      ,0x1a7,"Node verona::append_fq(Node, Node)");
      }
      this = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8);
      trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_c8);
      iVar3 = (int)peVar4;
      local_38.def = (TokenDef *)FQType;
      trieste::operator/((WFLookup *)local_258,node,&local_38);
      local_40.def = (TokenDef *)TypePath;
      trieste::wf::detail::WFLookup::operator/(&local_280,(WFLookup *)local_258,&local_40);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d8,
                 &local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
      trieste::clone((trieste *)&local_1b8,(__fn *)&local_d8,__child_stack_01,iVar3,in_R8);
      local_48.def = (TokenDef *)FQType;
      trieste::operator/(&local_b8,node,&local_48);
      local_50.def = (TokenDef *)Type;
      trieste::wf::detail::WFLookup::operator/(&local_98,&local_b8,&local_50);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e8,
                 &local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
      trieste::clone((trieste *)&local_1c8,(__fn *)&local_e8,__child_stack_02,iVar3,in_R8);
      trieste::operator<<((trieste *)&local_1a8,&local_1b8,&local_1c8);
      local_78.def = (TokenDef *)Selector;
      trieste::operator/(&local_70,node,&local_78);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f8,
                 &local_70.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
      trieste::clone((trieste *)&local_1d8,(__fn *)&local_f8,__child_stack_03,iVar3,in_R8);
      trieste::operator<<((trieste *)&local_198,&local_1a8,&local_1d8);
      trieste::operator<<((trieste *)&local_188,(Node *)local_c8,&local_198);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_108,in_RDX);
      trieste::operator<<((trieste *)fq,&local_188,(Node *)&local_108);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_188.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_198.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1a8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1c8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1b8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_00 = &local_250._M_refcount;
    }
    else if (pTVar1 == (TokenDef *)Selector) {
      this = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8);
      trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_118);
      iVar3 = (int)peVar4;
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_128,&node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)
      ;
      trieste::clone((trieste *)&local_1f8,(__fn *)&local_128,__child_stack_04,iVar3,in_R8);
      trieste::operator<<((trieste *)&local_1e8,(Node *)local_118,&local_1f8);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,in_RDX);
      trieste::operator<<((trieste *)fq,&local_1e8,(Node *)&local_138);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_00 = &local_128._M_refcount;
    }
    else {
      this = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8);
      trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_148);
      iVar3 = (int)peVar4;
      local_98.wf = (Wellformed *)TypePath;
      trieste::operator/(&local_280,node,(Token *)&local_98);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_158,
                 &local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
      trieste::clone((trieste *)&local_228,(__fn *)&local_158,__child_stack,iVar3,in_R8);
      local_b8.wf = (Wellformed *)Type;
      trieste::operator/((WFLookup *)local_258,node,(Token *)&local_b8);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_168,&local_250);
      trieste::clone((trieste *)&local_238,(__fn *)&local_168,__child_stack_00,iVar3,in_R8);
      trieste::operator<<((trieste *)&local_218,&local_228,&local_238);
      trieste::operator<<((trieste *)&local_208,(Node *)local_148,&local_218);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_178,in_RDX);
      trieste::operator<<((trieste *)fq,&local_208,(Node *)&local_178);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_208.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_218.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_238.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
      this_00 = &local_280.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
    NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)fq;
    return (Node)NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("node->in( {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector})",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                ,0x1a2,"Node verona::append_fq(Node, Node)");
}

Assistant:

Node append_fq(Node fq, Node node)
  {
    assert(fq->type().in({FQType, FQFunction}));
    assert(node->in(
      {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector}));

    if (fq == FQFunction)
    {
      // FQFunction + Selector = not allowed
      assert(node != Selector);

      // FQFunction + Type = FQType
      return FQType << (clone(fq / FQType / TypePath)
                        << clone(fq / FQType / Type) << clone(fq / Selector))
                    << node;
    }

    // FQType + Selector = FQFunction
    if (node == Selector)
      return FQFunction << clone(fq) << node;

    // FQType + Type = FQType
    return FQType << (clone(fq / TypePath) << clone(fq / Type)) << node;
  }